

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O3

void canvas_closebang(_glist *x)

{
  t_gobj *x_00;
  t_symbol *s;
  t_gotfn p_Var1;
  
  s = gensym("loadbang");
  for (x_00 = x->gl_list; x_00 != (t_gobj *)0x0; x_00 = x_00->g_next) {
    if ((x_00->g_pd != canvas_class) && (p_Var1 = zgetfn(&x_00->g_pd,s), p_Var1 != (t_gotfn)0x0)) {
      pd_vmess(&x_00->g_pd,s,"f",0x4000000000000000);
    }
  }
  return;
}

Assistant:

void canvas_closebang(t_canvas *x)
{
    t_gobj *y;
    t_symbol *s = gensym("loadbang");

    /* call the closebang()-method for objects that have one
     * but NOT for subpatches/abstractions: these are called separately
     * from g_graph:glist_delete()
     */
    for (y = x->gl_list; y; y = y->g_next)
        if ((pd_class(&y->g_pd) != canvas_class) && zgetfn(&y->g_pd, s))
            pd_vmess(&y->g_pd, s, "f", (t_floatarg)LB_CLOSE);
}